

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Privkey * __thiscall
cfd::core::Privkey::operator-=(Privkey *__return_storage_ptr__,Privkey *this,Privkey *right)

{
  undefined3 uVar1;
  NetType NVar2;
  Privkey key;
  Privkey local_58;
  Privkey local_38;
  
  CreateNegate(&local_38,right);
  CreateTweakAdd(&local_58,this,&local_38);
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ByteData::operator=(&this->data_,&local_58.data_);
  this->is_compressed_ = local_58.is_compressed_;
  *(undefined3 *)&this->field_0x19 = local_58._25_3_;
  this->net_type_ = local_58.net_type_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  uVar1 = *(undefined3 *)&this->field_0x19;
  NVar2 = this->net_type_;
  __return_storage_ptr__->is_compressed_ = this->is_compressed_;
  *(undefined3 *)&__return_storage_ptr__->field_0x19 = uVar1;
  __return_storage_ptr__->net_type_ = NVar2;
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator-=(const Privkey &right) {
  Privkey key = CreateTweakAdd(right.CreateNegate());
  *this = key;
  return *this;
}